

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# R10_Decoder.cc
# Opt level: O1

Array_Data_Symbol * __thiscall
R10_Decoder::InactivationDecoding
          (Array_Data_Symbol *__return_storage_ptr__,R10_Decoder *this,
          matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
          *A,Array_Data_Symbol *D,uint32_t *M)

{
  uint32_t uVar1;
  Array_Data_Symbol local_a0;
  
  Array_Data_Symbol::Array_Data_Symbol(__return_storage_ptr__);
  uVar1 = *M - this->sym_p->L;
  this->overhead = uVar1;
  this->N = uVar1 + this->sym_p->K;
  Indecoding_phase_1(&local_a0,this,A,D,M);
  __return_storage_ptr__->HP = local_a0.HP;
  __return_storage_ptr__->L = local_a0.L;
  __return_storage_ptr__->LP = local_a0.LP;
  __return_storage_ptr__->K = local_a0.K;
  __return_storage_ptr__->sym_len = local_a0.sym_len;
  __return_storage_ptr__->X = local_a0.X;
  __return_storage_ptr__->S = local_a0.S;
  __return_storage_ptr__->H = local_a0.H;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&__return_storage_ptr__->ESIs,&local_a0.ESIs);
  std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>::operator=
            (&__return_storage_ptr__->symbol,&local_a0.symbol);
  __return_storage_ptr__->_HP = local_a0._HP;
  __return_storage_ptr__->_L = local_a0._L;
  __return_storage_ptr__->_LP = local_a0._LP;
  __return_storage_ptr__->_sym_len = local_a0._sym_len;
  __return_storage_ptr__->_K = local_a0._K;
  __return_storage_ptr__->_X = local_a0._X;
  __return_storage_ptr__->_S = local_a0._S;
  __return_storage_ptr__->_H = local_a0._H;
  Array_Data_Symbol::~Array_Data_Symbol(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

class Array_Data_Symbol R10_Decoder::InactivationDecoding(matrix<uint8_t> &A, class Array_Data_Symbol &D, uint32_t &M)
{
	//class Array_Data_Symbol _D = D;
	//uint32_t _M = M;
	class Array_Data_Symbol result;


	overhead = M - sym_p->L;
	N = sym_p->K + overhead;
	//std::cout << "M : " << M << "  overhead: " << overhead << "  N: " << N << std::endl;



	result = Indecoding_phase_1(A, D, M);



	return result;
}